

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool testing::internal::ParseStringFlag<std::__cxx11::string>
               (char *str,char *flag,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  size_type __len1;
  char *__s;
  size_t __len2;
  
  __s = ParseFlagValue(str,flag,false);
  if (__s != (char *)0x0) {
    __len1 = value->_M_string_length;
    __len2 = strlen(__s);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (value,0,__len1,__s,__len2);
  }
  return __s != (char *)0x0;
}

Assistant:

static bool ParseStringFlag(const char* str, const char* flag, String* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == nullptr) return false;

  // Sets *value to the value of the flag.
  *value = value_str;
  return true;
}